

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

bool __thiscall OpenCLEnum::enumDevices(OpenCLEnum *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  iterator __first;
  iterator __last;
  ulong local_20;
  size_t k;
  OpenCLEnum *this_local;
  
  iVar2 = ocl_init();
  if (iVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Can\'t load OpenCL library");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    bVar1 = enumPlatforms(this);
    if (bVar1) {
      local_20 = 0;
      while( true ) {
        sVar4 = std::vector<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>::size
                          (&this->platforms_);
        if (sVar4 <= local_20) break;
        pvVar5 = std::vector<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>::
                 operator[](&this->platforms_,local_20);
        bVar1 = enumDevices(this,pvVar5->id);
        if (!bVar1) {
          pvVar5 = std::vector<OpenCLEnum::Platform,_std::allocator<OpenCLEnum::Platform>_>::
                   operator[](&this->platforms_,local_20);
          poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&pvVar5->name);
          poVar3 = std::operator<<(poVar3,": can\'t enumerate devices");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        local_20 = local_20 + 1;
      }
      __first = std::vector<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>::begin
                          (&this->devices_);
      __last = std::vector<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>::end
                         (&this->devices_);
      std::
      sort<__gnu_cxx::__normal_iterator<OpenCLEnum::Device*,std::vector<OpenCLEnum::Device,std::allocator<OpenCLEnum::Device>>>,bool(*)(OpenCLEnum::Device_const&,OpenCLEnum::Device_const&)>
                ((__normal_iterator<OpenCLEnum::Device_*,_std::vector<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>_>
                  )__first._M_current,
                 (__normal_iterator<OpenCLEnum::Device_*,_std::vector<OpenCLEnum::Device,_std::allocator<OpenCLEnum::Device>_>_>
                  )__last._M_current,compareDevice);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OpenCLEnum::enumDevices()
{
	if (!ocl_init()) {
		std::cerr << "Can't load OpenCL library" << std::endl;
		return false;
	}

	if (!enumPlatforms())
		return false;

	for (size_t k = 0; k < platforms_.size(); k++) {
		if (!enumDevices(platforms_[k].id)) {
			std::cerr << platforms_[k].name << ": can't enumerate devices" << std::endl;
		}
	}

	std::sort(devices_.begin(), devices_.end(), compareDevice);

	return true;
}